

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

UINT8 __thiscall
VGMPlayer::GetSongDeviceInfo
          (VGMPlayer *this,vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *devInfList)

{
  pointer *ppPVar1;
  pointer pPVar2;
  ulong uVar3;
  pointer pCVar4;
  DEV_DEF *pDVar5;
  iterator __position;
  UINT16 UVar6;
  pointer pSVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  PLR_DEV_INFO devInf;
  PLR_DEV_INFO local_48;
  
  if (this->_dLoad != (DATA_LOADER *)0x0) {
    pPVar2 = (devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
        super__Vector_impl_data._M_finish != pPVar2) {
      (devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
      super__Vector_impl_data._M_finish = pPVar2;
    }
    std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::reserve
              (devInfList,
               ((long)(this->_devCfgs).
                      super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_devCfgs).
                      super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
    pSVar7 = (this->_devCfgs).
             super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devCfgs).
        super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar7) {
      lVar10 = 0;
      uVar9 = 0;
      do {
        uVar3 = *(ulong *)((long)&pSVar7->deviceID + lVar10);
        local_48.devCfg =
             *(DEV_GEN_CFG **)
              ((long)&(pSVar7->cfgData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar10);
        pCVar4 = (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_48.type = (&pSVar7->type)[lVar10];
        local_48.id = *(undefined4 *)((long)&pSVar7->deviceID + lVar10);
        local_48.instance = (&pSVar7->instance)[lVar10];
        local_48.volume = 0;
        if ((pCVar4 == (pointer)0x0) ||
           ((ulong)(((long)(this->_devices).
                           super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 4) *
                   -0x1111111111111111) <= uVar3)) {
          local_48.core = 0;
          local_48.smplRate = 0;
          UVar6 = GetChipVolume(this,(&pSVar7->vgmChipType)[lVar10],(&pSVar7->instance)[lVar10],'\0'
                               );
          local_48.volume = UVar6;
          local_48._8_8_ = local_48._8_8_ & 0xffffffff;
        }
        else {
          pDVar5 = pCVar4[uVar3].base.defInf.devDef;
          if (pDVar5 == (DEV_DEF *)0x0) {
            local_48.core = 0;
          }
          else {
            local_48.core = pDVar5->coreID;
          }
          iVar8 = (int)pCVar4[uVar3].base.resmpl.volumeR + (int)pCVar4[uVar3].base.resmpl.volumeL;
          local_48.volume = (UINT16)((uint)(iVar8 - (iVar8 >> 0x1f)) >> 1);
          local_48.smplRate = pCVar4[uVar3].base.defInf.sampleRate;
        }
        __position._M_current =
             (devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<PLR_DEV_INFO,std::allocator<PLR_DEV_INFO>>::
          _M_realloc_insert<PLR_DEV_INFO_const&>
                    ((vector<PLR_DEV_INFO,std::allocator<PLR_DEV_INFO>> *)devInfList,__position,
                     &local_48);
        }
        else {
          (__position._M_current)->devCfg = local_48.devCfg;
          (__position._M_current)->id = local_48.id;
          (__position._M_current)->type = local_48.type;
          (__position._M_current)->instance = local_48.instance;
          (__position._M_current)->volume = local_48.volume;
          (__position._M_current)->core = local_48.core;
          (__position._M_current)->smplRate = local_48.smplRate;
          ppPVar1 = &(devInfList->super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + 1;
        }
        uVar9 = uVar9 + 1;
        pSVar7 = (this->_devCfgs).
                 super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x28;
      } while (uVar9 < (ulong)(((long)(this->_devCfgs).
                                      super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 3
                               ) * -0x3333333333333333));
    }
    return this->_playState & 1;
  }
  return 0xff;
}

Assistant:

UINT8 VGMPlayer::GetSongDeviceInfo(std::vector<PLR_DEV_INFO>& devInfList) const
{
	if (_dLoad == NULL)
		return 0xFF;
	
	size_t curDev;
	
	devInfList.clear();
	devInfList.reserve(_devCfgs.size());
	for (curDev = 0; curDev < _devCfgs.size(); curDev ++)
	{
		const SONG_DEV_CFG& sdCfg = _devCfgs[curDev];
		const DEV_GEN_CFG* dCfg = (const DEV_GEN_CFG*)&sdCfg.cfgData[0];
		const CHIP_DEVICE* cDev = (sdCfg.deviceID < _devices.size()) ? &_devices[sdCfg.deviceID] : NULL;
		PLR_DEV_INFO devInf;
		
		// chip configuration from VGM header
		memset(&devInf, 0x00, sizeof(PLR_DEV_INFO));
		devInf.type = sdCfg.type;
		devInf.id = (UINT32)sdCfg.deviceID;
		devInf.instance = (UINT8)sdCfg.instance;
		devInf.devCfg = dCfg;
		if (cDev != NULL)
		{
			// when playing, get information from device structures (may feature modified volume levels)
			const VGM_BASEDEV* clDev = &cDev->base;
			devInf.core = (clDev->defInf.devDef != NULL) ? clDev->defInf.devDef->coreID : 0x00;
			devInf.volume = (clDev->resmpl.volumeL + clDev->resmpl.volumeR) / 2;
			devInf.smplRate = clDev->defInf.sampleRate;
		}
		else
		{
			devInf.core = 0x00;
			devInf.volume = GetChipVolume(sdCfg.vgmChipType, sdCfg.instance, 0);
			devInf.smplRate = 0;
		}
		devInfList.push_back(devInf);
	}
	if (_playState & PLAYSTATE_PLAY)
		return 0x01;	// returned "live" data
	else
		return 0x00;	// returned data based on file header
}